

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O1

void gba_write_byte(uint32_t addr,uint8_t value,access_type_t access_type)

{
  ushort old_value;
  uint uVar1;
  ushort uVar2;
  bool bVar3;
  uint8_t uVar4;
  gbabus_t **ppgVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint value_00;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  addr_27b_t *paVar15;
  long lVar17;
  gba_ppu_t *pgVar18;
  ushort uVar19;
  addr_27b_t *paVar16;
  
  uVar13 = (ulong)addr;
  if (access_type == ACCESS_NONSEQUENTIAL) {
    piVar9 = nonsequential_byte_half_cycles;
LAB_00111f64:
    cpu->this_step_ticks = cpu->this_step_ticks + piVar9[addr >> 0x18];
  }
  else if (access_type == ACCESS_SEQUENTIAL) {
    piVar9 = sequential_byte_half_cycles;
    goto LAB_00111f64;
  }
  pgVar18 = ppu;
  switch((ulong)(addr >> 0x18)) {
  case 0:
    if (gba_log_verbosity != 0) {
      pcVar14 = "\x1b[0;33m[WARN]  Tried to write to the BIOS!\n\x1b[0;m";
LAB_001121d2:
      printf(pcVar14);
      return;
    }
    break;
  case 2:
    mem->ewram[addr & 0x3ffff] = value;
    break;
  case 3:
    mem->iwram[addr & 0x7fff] = value;
    break;
  case 4:
    if (0x40003ff < addr) {
      return;
    }
    uVar8 = addr & 0x700ffff;
    if ((addr & 0x700ffff) != 0x4000800) {
      uVar8 = addr;
    }
    uVar10 = 0x800;
    if ((uVar8 & 0x700ffff) != 0x4000800) {
      uVar10 = (ulong)(uVar8 + 0xfc000000);
    }
    if ((io_register_access[uVar10] & ~R) != W) {
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar14 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
      goto LAB_00111fe0;
    }
    if (uVar8 < 0x4000804) {
      uVar7 = uVar8 + 0xfc000000;
      if ((uVar8 & 0x700ffff) == 0x4000800) {
        uVar7 = 0x800;
      }
      uVar4 = io_register_sizes[uVar7];
    }
    else {
      uVar4 = '\0';
    }
    if (uVar4 == '\x04') {
      bVar6 = (char)addr * '\b';
      value_00 = (uint)value << (bVar6 & 0x1f);
      uVar8 = 0xff << (bVar6 & 0x1f);
      uVar7 = addr & 0xffc;
      if ((uVar7 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
        if ((uVar7 - 0x28 < 0x18) && (uVar7 = uVar7 - 0x28 >> 2, (0x33U >> (uVar7 & 0x1f) & 1) != 0)
           ) {
          lVar17 = *(long *)(&DAT_00127428 + (ulong)uVar7 * 8);
          if (ppu->y < 0xa1 || ppu->y == 0xe3) {
            uVar11 = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                              *(long *)(&DAT_00127458 + (ulong)uVar7 * 8));
            *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00127458 + (ulong)uVar7 * 8)
                     ) = (value_00 ^ uVar11) & uVar8 ^ uVar11;
          }
          uVar7 = *(uint *)((long)(pgVar18->screen + -1) + 0x3be + lVar17);
          *(uint *)((long)(pgVar18->screen + -1) + 0x3be + lVar17) =
               (value_00 ^ uVar7) & uVar8 ^ uVar7;
          return;
        }
        goto LAB_00112f93;
      }
      if (uVar7 == 0xa4) {
        iVar12 = 1;
LAB_001124a9:
        write_fifo(apu,iVar12,value_00,uVar8);
        return;
      }
      if (uVar7 == 0xa0) {
        iVar12 = 0;
        goto LAB_001124a9;
      }
      uVar13 = (ulong)(addr & 0x7fffffc);
      uVar11 = addr & 0x700fffc;
      if ((addr & 0x700fffc) != 0x4000800) {
        uVar11 = addr & 0x7fffffc;
      }
      if (0x4000803 < uVar11) {
LAB_001125ff:
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar14 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
        goto LAB_00111fe0;
      }
      uVar10 = 0x800;
      if ((uVar11 & 0x700fffc) != 0x4000800) {
        uVar10 = (ulong)(uVar11 + 0xfc000000);
      }
      if ((io_register_access[uVar10] & ~R) != W) goto LAB_001125ff;
      if (uVar11 < 0x4000804) {
        uVar1 = uVar11 + 0xfc000000;
        if ((uVar11 & 0x700fffc) == 0x4000800) {
          uVar1 = 0x800;
        }
        if (io_register_sizes[uVar1] == '\x04') {
          paVar16 = (addr_27b_t *)0x0;
          paVar15 = (addr_27b_t *)0x0;
          if (uVar7 < 0xbc) {
            if (uVar7 < 0xa0) {
              if (uVar7 < 0x38) {
                if (uVar7 == 0x28) {
                  lVar17 = 0x3ecac;
                }
                else {
                  if (uVar7 != 0x2c) goto LAB_00112fb4;
                  lVar17 = 0x3ecb4;
                }
              }
              else if (uVar7 == 0x38) {
                lVar17 = 0x3ecbc;
              }
              else {
                if (uVar7 != 0x3c) goto LAB_00112fb4;
                lVar17 = 0x3ecc4;
              }
              paVar15 = (addr_27b_t *)((long)(ppu->screen + -1) + 0x3be + lVar17);
            }
            else if (uVar7 < 0xb0) {
              if ((uVar7 != 0xa0) && (uVar7 != 0xa4)) goto LAB_00112fb4;
            }
            else if (uVar7 == 0xb0) {
              paVar15 = &bus->DMA0SAD;
            }
            else {
              if (uVar7 != 0xb4) goto LAB_00112fb4;
              paVar15 = &bus->DMA0DAD;
            }
          }
          else if (uVar7 < 0xd4) {
            if (uVar7 < 200) {
              if (uVar7 == 0xbc) {
                paVar15 = (addr_27b_t *)&bus->DMA1SAD;
              }
              else {
                if (uVar7 != 0xc0) goto LAB_00112fb4;
                paVar15 = &bus->DMA1DAD;
              }
            }
            else if (uVar7 == 200) {
              paVar15 = (addr_27b_t *)&bus->DMA2SAD;
            }
            else {
              if (uVar7 != 0xcc) goto LAB_00112fb4;
              paVar15 = &bus->DMA2DAD;
            }
          }
          else if (uVar7 < 0x150) {
            if (uVar7 == 0xd4) {
              paVar15 = (addr_27b_t *)&bus->DMA3SAD;
            }
            else {
              if (uVar7 != 0xd8) goto LAB_00112fb4;
              paVar15 = (addr_27b_t *)&bus->DMA3DAD;
            }
          }
          else {
            paVar15 = paVar16;
            if (((uVar7 != 0x150) && (uVar7 != 0x154)) && (uVar7 != 0x800)) goto LAB_00112fb4;
          }
          if (paVar15 != (addr_27b_t *)0x0) {
            paVar15->raw = (value_00 ^ paVar15->raw) & uVar8 ^ paVar15->raw;
            return;
          }
          if (gba_log_verbosity == 0) {
            return;
          }
          pcVar14 = 
          "\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m";
          uVar10 = (ulong)uVar8;
          goto LAB_001121b0;
        }
      }
      goto LAB_00112fa8;
    }
    if (uVar4 != '\x02') {
      if ((addr & 0xfff) == 0x300) {
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar14 = "\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m";
        goto LAB_001121d2;
      }
      if ((addr & 0xfff) != 0x301) goto LAB_00112f98;
      if ((value & 1) == 0) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
        }
        cpu->halt = true;
        return;
      }
      goto LAB_00112fa3;
    }
    bVar6 = (char)addr * '\b' & 8;
    uVar2 = (ushort)value << bVar6;
    uVar19 = (ushort)(0xff << bVar6);
    uVar8 = addr & 0xffe;
    if (0x7f < uVar8) {
      if (uVar8 < 0x100) {
        if (0x9b < uVar8) {
          if (uVar8 < 0xc6) {
            if (uVar8 < 0xb8) {
              if ((uVar8 == 0x9c) || (uVar8 == 0x9e)) goto switchD_00112486_caseD_80;
              goto switchD_00112638_caseD_206;
            }
            if (uVar8 == 0xb8) {
              pgVar18 = (gba_ppu_t *)&bus->DMA0CNT_L;
            }
            else if (uVar8 == 0xba) {
              pgVar18 = (gba_ppu_t *)&bus->DMA0CNT_H;
            }
            else {
              if (uVar8 != 0xc4) goto switchD_00112638_caseD_206;
              pgVar18 = (gba_ppu_t *)&bus->DMA1CNT_L;
            }
          }
          else if (uVar8 < 0xd2) {
            if (uVar8 == 0xc6) {
              pgVar18 = (gba_ppu_t *)&bus->DMA1CNT_H;
            }
            else {
              if (uVar8 != 0xd0) goto switchD_00112638_caseD_206;
              pgVar18 = (gba_ppu_t *)&bus->DMA2CNT_L;
            }
          }
          else if (uVar8 == 0xd2) {
            pgVar18 = (gba_ppu_t *)&bus->DMA2CNT_H;
          }
          else if (uVar8 == 0xdc) {
            pgVar18 = (gba_ppu_t *)&bus->DMA3CNT_L;
          }
          else {
            if (uVar8 != 0xde) goto switchD_00112638_caseD_206;
            pgVar18 = (gba_ppu_t *)&bus->DMA3CNT_H;
          }
          goto LAB_00112c75;
        }
        if (uVar8 < 0x92) {
          switch(uVar8) {
          case 0x80:
          case 0x82:
          case 0x84:
switchD_00112486_caseD_80:
            if (gba_log_verbosity == 0) goto LAB_00112a41;
            pcVar14 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
            goto LAB_00112892;
          case 0x86:
            break;
          case 0x88:
            ppgVar5 = &bus;
            lVar17 = 0x96;
            goto LAB_00112c72;
          default:
            if (uVar8 == 0x90) goto switchD_00112486_caseD_80;
          }
        }
        else if (uVar8 < 0x96) {
          if ((uVar8 == 0x92) || (uVar8 == 0x94)) goto switchD_00112486_caseD_80;
        }
        else if ((uVar8 == 0x96) || ((uVar8 == 0x98 || (uVar8 == 0x9a))))
        goto switchD_00112486_caseD_80;
        goto switchD_00112638_caseD_206;
      }
      if (uVar8 < 0x140) {
        switch(uVar8) {
        case 0x120:
        case 0x122:
        case 0x124:
        case 0x126:
        case 0x128:
        case 0x12a:
switchD_0011266a_caseD_120:
          if (gba_log_verbosity == 0) goto LAB_00112a41;
          pcVar14 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
LAB_00112892:
          pgVar18 = (gba_ppu_t *)0x0;
          printf(pcVar14,(ulong)uVar8);
          goto LAB_00112c75;
        case 300:
        case 0x12e:
          goto switchD_00112638_caseD_206;
        case 0x130:
          pgVar18 = (gba_ppu_t *)&bus->KEYINPUT;
          goto LAB_00112c75;
        case 0x132:
          ppgVar5 = &bus;
          lVar17 = 0x94;
          break;
        case 0x134:
          ppgVar5 = &bus;
          lVar17 = 0x90;
          break;
        default:
          switch(uVar8) {
          case 0x100:
            ppgVar5 = &bus;
            lVar17 = 0xa2;
            break;
          case 0x102:
            ppgVar5 = &bus;
            lVar17 = 0xac;
            break;
          case 0x104:
            ppgVar5 = &bus;
            lVar17 = 0xa4;
            break;
          case 0x106:
            ppgVar5 = &bus;
            lVar17 = 0xb0;
            break;
          case 0x108:
            ppgVar5 = &bus;
            lVar17 = 0xa6;
            break;
          case 0x10a:
            ppgVar5 = &bus;
            lVar17 = 0xb4;
            break;
          case 0x10c:
            ppgVar5 = &bus;
            lVar17 = 0xa8;
            break;
          case 0x10e:
            ppgVar5 = &bus;
            lVar17 = 0xb8;
            break;
          default:
            goto switchD_00112638_caseD_206;
          }
        }
        goto LAB_00112c72;
      }
      if (uVar8 < 0x158) {
        if (uVar8 != 0x140) {
          if ((uVar8 == 0x150) || (uVar8 == 0x154)) goto switchD_0011266a_caseD_120;
          goto switchD_00112638_caseD_206;
        }
        ppgVar5 = &bus;
        lVar17 = 0x92;
        goto LAB_00112c72;
      }
      switch(uVar8) {
      case 0x200:
        pgVar18 = (gba_ppu_t *)&bus->interrupt_enable;
        break;
      case 0x202:
        pgVar18 = (gba_ppu_t *)&bus->IF;
        break;
      case 0x204:
        ppgVar5 = &bus;
        lVar17 = 0xcc;
        goto LAB_00112c72;
      case 0x208:
        ppgVar5 = &bus;
        goto LAB_00112999;
      default:
        if (uVar8 == 0x158) goto switchD_0011266a_caseD_120;
      case 0x206:
switchD_00112638_caseD_206:
        gba_write_byte_cold_6();
LAB_00112fb4:
        gba_write_byte_cold_4();
      }
      goto LAB_00112c75;
    }
    if (0x5f < uVar8) {
      if (uVar8 < 0x70) {
        if (uVar8 < 100) {
          if ((uVar8 == 0x60) || (uVar8 == 0x62)) goto switchD_00112486_caseD_80;
        }
        else if ((uVar8 == 100) || ((uVar8 == 0x68 || (uVar8 == 0x6c))))
        goto switchD_00112486_caseD_80;
      }
      else if (uVar8 < 0x74) {
        if ((uVar8 == 0x70) || (uVar8 == 0x72)) goto switchD_00112486_caseD_80;
      }
      else if ((uVar8 == 0x74) || ((uVar8 == 0x78 || (uVar8 == 0x7c))))
      goto switchD_00112486_caseD_80;
      goto switchD_00112638_caseD_206;
    }
    switch(uVar8) {
    case 0:
      lVar17 = 0x3ec34;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 2:
      if (gba_log_verbosity == 0) {
LAB_00112a41:
        pgVar18 = (gba_ppu_t *)0x0;
      }
      else {
        pgVar18 = (gba_ppu_t *)0x0;
        printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
      }
      goto LAB_00112c75;
    case 4:
      lVar17 = 0x3eccc;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 6:
      ppgVar5 = (gbabus_t **)&ppu;
LAB_00112999:
      pgVar18 = (gba_ppu_t *)*ppgVar5;
      goto LAB_00112c75;
    case 8:
      lVar17 = 0x3ec38;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 10:
      lVar17 = 0x3ec3c;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0xc:
      lVar17 = 0x3ec40;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0xe:
      lVar17 = 0x3ec44;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x10:
      lVar17 = 0x3ec48;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x12:
      lVar17 = 0x3ec4c;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x14:
      lVar17 = 0x3ec50;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x16:
      lVar17 = 0x3ec54;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x18:
      lVar17 = 0x3ec58;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x1a:
      lVar17 = 0x3ec5c;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x1c:
      lVar17 = 0x3ec60;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x1e:
      lVar17 = 0x3ec64;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x20:
      lVar17 = 0x3ec68;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x22:
      lVar17 = 0x3ec6c;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x24:
      lVar17 = 0x3ec70;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x26:
      lVar17 = 0x3ec74;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    default:
      goto switchD_00112638_caseD_206;
    case 0x30:
      lVar17 = 0x3ec78;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x32:
      lVar17 = 0x3ec7c;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x34:
      lVar17 = 0x3ec80;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x36:
      lVar17 = 0x3ec84;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x40:
      lVar17 = 0x3ec88;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x42:
      lVar17 = 0x3ec8c;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x44:
      lVar17 = 0x3ec90;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x46:
      lVar17 = 0x3ec94;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x48:
      lVar17 = 0x3ec98;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x4a:
      lVar17 = 0x3ec9a;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x4c:
      lVar17 = 0x3ec9c;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x50:
      lVar17 = 0x3eca0;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x52:
      lVar17 = 0x3eca4;
      ppgVar5 = (gbabus_t **)&ppu;
      break;
    case 0x54:
      lVar17 = 0x3eca8;
      ppgVar5 = (gbabus_t **)&ppu;
    }
LAB_00112c72:
    pgVar18 = (gba_ppu_t *)((long)(((gba_ppu_t *)*ppgVar5)->screen + -1) + 0x3be + lVar17);
LAB_00112c75:
    if (pgVar18 != (gba_ppu_t *)0x0) {
      if (uVar8 == 0x208) {
        uVar19 = 1;
      }
      else {
        if (uVar8 == 0x202) {
          (bus->IF).raw = (bus->IF).raw & ~uVar2;
          return;
        }
        if (uVar8 == 4) {
          uVar19 = uVar19 & 0xfff8;
        }
      }
      old_value = ((DMACNTH_t *)&pgVar18->y)->raw;
      ((DMACNTH_t *)&pgVar18->y)->raw = (uVar2 ^ old_value) & uVar19 ^ old_value;
      if (uVar8 < 0xdc) {
        if (uVar8 < 0xc6) {
          if (uVar8 != 0xb8) {
            if (uVar8 == 0xba) {
              if (-1 < (short)(bus->DMA0CNT_H).raw) {
                (bus->DMA0INT).previously_enabled = false;
              }
            }
            else if (uVar8 != 0xc4) {
              return;
            }
          }
        }
        else if (uVar8 == 0xc6) {
          if (-1 < (short)(bus->DMA1CNT_H).raw) {
            (bus->DMA1INT).previously_enabled = false;
          }
        }
        else if (uVar8 != 0xd0) {
          if (uVar8 != 0xd2) {
            return;
          }
          if (-1 < (short)(bus->DMA2CNT_H).raw) {
            (bus->DMA2INT).previously_enabled = false;
          }
        }
      }
      else {
        if (0x105 < uVar8) {
          if (uVar8 < 0x10e) {
            if (uVar8 == 0x106) {
              iVar12 = 1;
            }
            else {
              if (uVar8 != 0x10a) {
                return;
              }
              iVar12 = 2;
            }
          }
          else {
            if (uVar8 != 0x10e) {
              if (uVar8 != 0x204) {
                return;
              }
              on_waitcnt_updated();
              return;
            }
            iVar12 = 3;
          }
LAB_00112df7:
          tmcnth_write(iVar12,old_value);
          return;
        }
        if (uVar8 != 0xdc) {
          if (uVar8 != 0xde) {
            if (uVar8 != 0x102) {
              return;
            }
            iVar12 = 0;
            goto LAB_00112df7;
          }
          if (-1 < (short)(bus->DMA3CNT_H).raw) {
            (bus->DMA3INT).previously_enabled = false;
          }
        }
      }
      gba_dma();
      return;
    }
    if (gba_log_verbosity != 0) {
      pcVar14 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
      uVar13 = (ulong)(addr & 0x7fffffe);
LAB_00111fe0:
      printf(pcVar14,uVar13);
      return;
    }
    break;
  case 5:
    ppu->pram[addr & 0x3fe] = value;
    ppu->pram[(ulong)(addr & 0x3fe) + 1] = value;
    break;
  case 6:
    bVar3 = (addr & 0xffff0000) == 0x6000000;
    if ((ushort)(((ppu->DISPCNT).raw & 7) - 3) < 3) {
      bVar3 = addr + 0xfa000000 < 0x14000;
    }
    if (bVar3) {
      uVar8 = (addr + 0xfa000000) % 0x18000;
      ppu->vram[uVar8 & 0x1fffe] = value;
      ppu->vram[(ulong)uVar8 | 1] = value;
    }
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    if ((bus->backup_type != EEPROM) || ((addr < 0xdffff00 && (0x1000000 < mem->rom_size)))) {
      if (gba_log_verbosity < 3) {
        return;
      }
      pcVar14 = "[DEBUG] Ignoring write to cartridge space address 0x%08X\n";
      goto LAB_00111fe0;
    }
    gba_write_byte_cold_1();
switchD_00112017_default:
    gba_write_byte_cold_2();
LAB_00112f93:
    gba_write_byte_cold_3();
LAB_00112f98:
    gba_write_byte_cold_8();
LAB_00112fa3:
    gba_write_byte_cold_7();
LAB_00112fa8:
    gba_write_byte_cold_5();
    goto switchD_00112638_caseD_206;
  case 0xe:
  case 0xf:
    switch(bus->backup_type) {
    case UNKNOWN:
      if (gba_log_verbosity != 0) {
        pcVar14 = "\x1b[0;33m[WARN]  Tried to access backup when backup type unknown!\n\x1b[0;m";
        goto LAB_001121d2;
      }
      break;
    case SRAM:
      mem->backup[addr & 0x7fff] = value;
      mem->backup_dirty = true;
      break;
    case EEPROM:
      if (gba_log_verbosity == 0) {
        return;
      }
      uVar10 = (ulong)value;
      pcVar14 = "\x1b[0;33m[WARN]  Ignoring byte write to EEPROM: [0x%08X]=0x%02X\n\x1b[0;m";
LAB_001121b0:
      printf(pcVar14,uVar13,uVar10);
      return;
    case FLASH64K:
    case FLASH128K:
      write_byte_flash(mem,bus,addr,value);
      return;
    default:
      goto switchD_00112017_default;
    }
  }
  return;
}

Assistant:

void gba_write_byte(word addr, byte value, access_type_t access_type) {
    addr &= ~(sizeof(byte) - 1);
    half region = addr >> 24;
    tick_memory_waitstate(access_type, sizeof(byte), region);
    switch (region) {
        case REGION_BIOS: {
            logwarn("Tried to write to the BIOS!")
            break;
        }
        case REGION_EWRAM: {
            word index = (addr - 0x02000000) % 0x40000;
            mem->ewram[index] = value;
            break;
        }
        case REGION_IWRAM: {
            word index = (addr - 0x03000000) % 0x8000;
            mem->iwram[index] = value;
            break;
        }
        case REGION_IOREG: {
            if (addr < 0x04000400) {
                write_byte_ioreg(addr, value);
            }
#ifdef ENABLE_MGBA_DEBUG
            else {
                if (addr == 0x4FFF700 || addr == 0x4FFF780 || (addr >= 0x4FFF600 && addr < 0x4FFF700)) {
                    mgba_debug_write_byte(addr, value);
                } else {
                    logwarn("Write 0x%02X to 0x%08X\n", value, addr)
                }
            }
#endif
            break;
        }
        case REGION_PRAM: {
            word index = (addr - 0x5000000) % 0x400;
            word lower_index = index & 0xFFFFFFFE;
            word upper_index = lower_index + 1;
            ppu->pram[lower_index] = value;
            ppu->pram[upper_index] = value;
            break;
        }
        case REGION_VRAM: {
            word index = addr - 0x06000000;
            index %= VRAM_SIZE;
            // Special case for single byte writes to VRAM, OBJ writes are ignored.
            if (is_bg(addr)) {
                word lower_index = index & 0xFFFFFFFE;
                word upper_index = lower_index + 1;
                ppu->vram[lower_index] = value;
                ppu->vram[upper_index] = value;
            }
            break;
        }
        case REGION_OAM: {
            break; // 8 bit writes to OAM are ignored
        }
        case REGION_GAMEPAK0_L:
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L:
        case REGION_GAMEPAK2_H: {
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || addr >= 0xDFFFF00) {
                    logfatal("Write byte 0x%02X to EEPROM at addr 0x%08X", value, addr)
                }
            }
            logdebug("Ignoring write to cartridge space address 0x%08X", addr)
            break;
        }
        case REGION_SRAM:
        case REGION_SRAM_MIRR:
            // Backup space
            switch (bus->backup_type) {
                case SRAM:
                    mem->backup[addr & 0x7FFF] = value;
                    mem->backup_dirty = true;
                    break;
                case UNKNOWN:
                    logwarn("Tried to access backup when backup type unknown!")
                    break;
                case EEPROM:
                    logwarn("Ignoring byte write to EEPROM: [0x%08X]=0x%02X", addr, value)
                    break;
                case FLASH64K:
                case FLASH128K:
                    write_byte_flash(mem, bus, addr, value);
                    break;
                default:
                    logfatal("Unknown backup type index %d!", bus->backup_type)
            }
            break;
        default:
            return;
    }
}